

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall Node::Stat(Node *this,DiskInterface *disk_interface,string *err)

{
  Metrics *this_00;
  int iVar1;
  long lVar2;
  Metric *pMVar3;
  allocator<char> local_41;
  ScopedMetric metrics_h_scoped;
  
  if (Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar1 = __cxa_guard_acquire(&Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar1 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar3 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&metrics_h_scoped,"node stat",&local_41);
        pMVar3 = Metrics::NewMetric(this_00,(string *)&metrics_h_scoped);
        std::__cxx11::string::~string((string *)&metrics_h_scoped);
      }
      Stat::metrics_h_metric = pMVar3;
      __cxa_guard_release(&Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,Stat::metrics_h_metric);
  lVar2 = (**(code **)(*(long *)disk_interface + 0x18))(disk_interface,this,err);
  this->mtime_ = lVar2;
  if (lVar2 != -1) {
    this->exists_ = ExistenceStatusExists - (lVar2 == 0);
  }
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return lVar2 != -1;
}

Assistant:

bool Node::Stat(DiskInterface* disk_interface, string* err) {
  METRIC_RECORD("node stat");
  mtime_ = disk_interface->Stat(path_, err);
  if (mtime_ == -1) {
    return false;
  }
  exists_ = (mtime_ != 0) ? ExistenceStatusExists : ExistenceStatusMissing;
  return true;
}